

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

lzma_bool lzma_mf_is_supported(lzma_match_finder mf)

{
  bool local_d;
  _Bool ret;
  lzma_match_finder mf_local;
  
  local_d = mf == LZMA_MF_HC4 || mf == LZMA_MF_HC3;
  if (mf == LZMA_MF_BT2) {
    local_d = true;
  }
  if (mf == LZMA_MF_BT3) {
    local_d = true;
  }
  if (mf == LZMA_MF_BT4) {
    local_d = true;
  }
  return local_d;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_mf_is_supported(lzma_match_finder mf)
{
	bool ret = false;

#ifdef HAVE_MF_HC3
	if (mf == LZMA_MF_HC3)
		ret = true;
#endif

#ifdef HAVE_MF_HC4
	if (mf == LZMA_MF_HC4)
		ret = true;
#endif

#ifdef HAVE_MF_BT2
	if (mf == LZMA_MF_BT2)
		ret = true;
#endif

#ifdef HAVE_MF_BT3
	if (mf == LZMA_MF_BT3)
		ret = true;
#endif

#ifdef HAVE_MF_BT4
	if (mf == LZMA_MF_BT4)
		ret = true;
#endif

	return ret;
}